

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O2

string_type *
booster::operator+(string_type *__return_storage_ptr__,sub_match<const_char_*> *l,value_type *r)

{
  string_type sStack_38;
  
  sub_match<char_const*>::str_abi_cxx11_(&sStack_38,l);
  std::operator+(__return_storage_ptr__,&sStack_38,r);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

typename sub_match<Iterator>::string_type 
	operator+(sub_match<Iterator> const &l,typename sub_match<Iterator>::value_type const *r)
	{ return l.str() + r; }